

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.cpp
# Opt level: O2

void duckdb::TemplatedGenerateSequence<long>
               (Vector *result,idx_t count,int64_t start,int64_t increment)

{
  data_ptr_t pdVar1;
  long lVar2;
  idx_t i;
  idx_t iVar3;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar1 = result->data;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    lVar2 = increment;
    if (iVar3 == 0) {
      lVar2 = 0;
    }
    start = start + lVar2;
    *(int64_t *)(pdVar1 + iVar3 * 8) = start;
  }
  return;
}

Assistant:

void TemplatedGenerateSequence(Vector &result, idx_t count, int64_t start, int64_t increment) {
	D_ASSERT(result.GetType().IsNumeric());
	if (start > NumericLimits<T>::Maximum() || increment > NumericLimits<T>::Maximum()) {
		throw InternalException("Sequence start or increment out of type range");
	}
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<T>(result);
	auto value = T(start);
	for (idx_t i = 0; i < count; i++) {
		if (i > 0) {
			value += increment;
		}
		result_data[i] = value;
	}
}